

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture1DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int lodOffsNdx;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  Texture1DView TVar31;
  Vec2 lodO;
  Vec4 resPix;
  Vec2 lodBounds;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture1DView src;
  Vec2 clampedLod;
  undefined1 local_228 [16];
  Vec2 local_218;
  float local_210;
  float local_20c;
  float local_208;
  float local_204;
  float local_200;
  float local_1fc;
  Vec4 local_1f8;
  PixelBufferAccess *local_1e8;
  ulong local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  Sampler *local_1a8;
  ConstPixelBufferAccess *local_1a0;
  float local_198 [4];
  undefined8 local_188;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_178;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  Texture1DView local_118;
  float local_108;
  undefined8 uStack_104;
  float fStack_fc;
  undefined8 local_f8;
  undefined1 local_e8 [4];
  float fStack_e4;
  ConstPixelBufferAccess *pCStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  float fStack_3c;
  tcu local_38 [8];
  
  local_178.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = sampleParams->baseLevel;
  iVar5 = baseView->m_numLevels + -1;
  iVar8 = iVar5;
  if (iVar3 < iVar5) {
    iVar8 = iVar3;
  }
  iVar6 = 0;
  if (-1 < iVar3) {
    iVar6 = iVar8;
  }
  iVar3 = sampleParams->maxLevel;
  if (iVar3 < iVar5) {
    iVar5 = iVar3;
  }
  iVar8 = 1;
  if (iVar6 <= iVar3) {
    iVar8 = (iVar5 - iVar6) + 1;
  }
  pCStack_e0 = baseView->m_levels + iVar6;
  local_e8 = (undefined1  [4])iVar8;
  local_1a8 = &sampleParams->sampler;
  local_1e8 = errorMask;
  local_1a0 = reference;
  TVar31 = tcu::getEffectiveTextureView((Texture1DView *)local_e8,&local_178,local_1a8);
  local_118.m_levels = TVar31.m_levels;
  local_118.m_numLevels = TVar31.m_numLevels;
  local_198[0] = *texCoord;
  local_198[1] = texCoord[1];
  local_198[2] = texCoord[2];
  local_198[3] = texCoord[3];
  local_1d8 = ZEXT816(0);
  local_1b8 = ZEXT816(0);
  if (0 < local_118.m_numLevels) {
    local_1b8 = ZEXT416((uint)(float)((local_118.m_levels)->m_size).m_data[0]);
  }
  fVar16 = (float)(result->m_size).m_data[0];
  fVar17 = (float)(result->m_size).m_data[1];
  local_188 = CONCAT44(local_198[1],local_198[2]);
  local_108 = (sampleParams->super_RenderParams).w.m_data[0];
  uStack_104._0_4_ = (sampleParams->super_RenderParams).w.m_data[1];
  uStack_104._4_4_ = (sampleParams->super_RenderParams).w.m_data[2];
  fStack_fc = (sampleParams->super_RenderParams).w.m_data[3];
  local_f8 = CONCAT44((float)uStack_104,uStack_104._4_4_);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_1d8 = ZEXT416((uint)(sampleParams->super_RenderParams).bias);
  }
  local_e8 = (undefined1  [4])0xbf800000;
  fStack_e4 = 0.0;
  pCStack_e0 = (ConstPixelBufferAccess *)0x3f800000;
  local_d8 = 0xbf80000000000000;
  uStack_d0 = 0x3f80000000000000;
  local_228._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)local_228);
  tcu::clear(local_1e8,&local_1f8);
  if ((result->m_size).m_data[1] < 1) {
    iVar3 = 0;
  }
  else {
    local_1d8._4_4_ = local_1d8._0_4_;
    local_1d8._8_4_ = local_1d8._0_4_;
    local_1d8._12_4_ = local_1d8._0_4_;
    iVar3 = 0;
    iVar8 = 0;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (result->m_size).m_data[0]) {
        fVar18 = (float)iVar8 + 0.5;
        local_148 = ZEXT416((uint)fVar18);
        local_20c = fVar17 - fVar18;
        local_158 = ZEXT416((uint)(fVar18 / fVar17));
        local_210 = 1.0 - fVar18 / fVar17;
        iVar5 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_228,(int)result,iVar5,iVar8);
          auVar11._0_4_ =
               (float)local_228._0_4_ - (sampleParams->super_RenderParams).colorBias.m_data[0];
          auVar11._4_4_ =
               (float)local_228._4_4_ - (sampleParams->super_RenderParams).colorBias.m_data[1];
          auVar11._8_4_ =
               (float)local_228._8_4_ - (sampleParams->super_RenderParams).colorBias.m_data[2];
          auVar11._12_4_ =
               (float)local_228._12_4_ - (sampleParams->super_RenderParams).colorBias.m_data[3];
          local_1f8.m_data =
               (float  [4])
               divps(auVar11,*(undefined1 (*) [16])
                              (sampleParams->super_RenderParams).colorScale.m_data);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_228,(int)local_1a0,iVar5,iVar8);
          auVar12._0_4_ =
               (float)local_228._0_4_ - (sampleParams->super_RenderParams).colorBias.m_data[0];
          auVar12._4_4_ =
               (float)local_228._4_4_ - (sampleParams->super_RenderParams).colorBias.m_data[1];
          auVar12._8_4_ =
               (float)local_228._8_4_ - (sampleParams->super_RenderParams).colorBias.m_data[2];
          auVar12._12_4_ =
               (float)local_228._12_4_ - (sampleParams->super_RenderParams).colorBias.m_data[3];
          auVar13 = divps(auVar12,*(undefined1 (*) [16])
                                   (sampleParams->super_RenderParams).colorScale.m_data);
          fVar18 = local_1f8.m_data[0] - auVar13._0_4_;
          fVar19 = local_1f8.m_data[1] - auVar13._4_4_;
          fVar20 = local_1f8.m_data[2] - auVar13._8_4_;
          fVar21 = local_1f8.m_data[3] - auVar13._12_4_;
          auVar14._0_8_ = CONCAT44(fVar19,fVar18) ^ 0x8000000080000000;
          auVar14._8_4_ = -fVar20;
          auVar14._12_4_ = -fVar21;
          auVar13._4_4_ = fVar19;
          auVar13._0_4_ = fVar18;
          auVar13._8_4_ = fVar20;
          auVar13._12_4_ = fVar21;
          auVar13 = maxps(auVar14,auVar13);
          auVar15._4_4_ = -(uint)(auVar13._4_4_ <= (lookupPrec->colorThreshold).m_data[1]);
          auVar15._0_4_ = -(uint)(auVar13._0_4_ <= (lookupPrec->colorThreshold).m_data[0]);
          auVar15._8_4_ = -(uint)(auVar13._8_4_ <= (lookupPrec->colorThreshold).m_data[2]);
          auVar15._12_4_ = -(uint)(auVar13._12_4_ <= (lookupPrec->colorThreshold).m_data[3]);
          auVar13 = packssdw(auVar15,auVar15);
          auVar13 = packsswb(auVar13,auVar13);
          local_228._0_4_ = SUB164(auVar13 & _DAT_01b805f0,0);
          if (SUB161(auVar13 & _DAT_01b805f0,0) == '\0') {
LAB_018c2c54:
            fVar21 = (float)iVar5 + 0.5;
            fVar18 = fVar21 / fVar16;
            bVar2 = 1.0 <= (float)local_158._0_4_ + fVar18;
            local_204 = (float)local_158._0_4_;
            fVar19 = fVar21;
            fVar20 = (float)local_148._0_4_;
            if (bVar2) {
              fVar18 = 1.0 - fVar18;
              local_204 = local_210;
              fVar19 = fVar16 - fVar21;
              fVar20 = local_20c;
            }
            local_1c8 = ZEXT416((uint)fVar18);
            uVar4 = (ulong)bVar2;
            fVar23 = local_198[uVar4 * 3];
            local_208 = local_198[uVar4 * 3 + 1];
            local_b8 = (&local_108)[uVar4 * 3];
            fVar29 = local_198[uVar4 * 3 + 2];
            local_128 = *(undefined8 *)((long)&uStack_104 + uVar4 * 0xc);
            fVar24 = (float)local_128;
            local_138 = (float)((ulong)local_128 >> 0x20);
            local_58 = local_138 * fVar16;
            fVar30 = (fVar23 - local_208) * local_138;
            local_78 = local_138 * fVar24;
            fVar22 = (fVar16 * (local_204 + -1.0) + fVar21) * local_78 -
                     (local_58 * local_204 + fVar21 * fVar24) * local_b8;
            fVar27 = local_b8 * fVar24 * local_138;
            local_1fc = (fVar23 - fVar29) * fVar24;
            local_200 = (local_208 - fVar23) * local_138 + (fVar29 - local_208) * local_b8;
            fVar21 = fVar27 * fVar16;
            local_98 = ZEXT416((uint)fVar21);
            local_a8 = CONCAT44(local_138,fVar24 * fVar17);
            uStack_a0 = 0;
            uStack_120 = 0;
            local_48 = (local_208 - fVar29) * local_b8 + (fVar29 - fVar23) * fVar24;
            fStack_44 = fVar24 * fVar17 * fVar18 + (float)local_148._0_4_ * local_138;
            fStack_3c = local_138 * 0.0 + (float)local_148._4_4_ * 0.0;
            local_c8 = ZEXT416((uint)local_b8);
            local_b8 = -local_b8;
            uStack_b4 = 0x80000000;
            uStack_b0 = 0x80000000;
            uStack_ac = 0x80000000;
            uStack_40 = 0;
            local_68 = CONCAT44(local_78,fVar30);
            uStack_60 = 0;
            fVar24 = (fVar17 * (fVar18 + -1.0) + (float)local_148._0_4_) * local_78 +
                     local_b8 * fStack_44;
            fVar27 = fVar27 * fVar17;
            local_88 = ZEXT416((uint)fVar27);
            fStack_134 = local_138;
            fStack_130 = local_138;
            fStack_12c = local_138;
            fStack_74 = local_78;
            fStack_70 = local_78;
            fStack_6c = local_78;
            fStack_54 = local_138;
            fStack_50 = local_138;
            fStack_4c = local_138;
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&local_1e0,
                       ((((local_204 + -1.0) * local_1fc + local_204 * local_200) * fVar21) /
                       (fVar22 * fVar22)) * (float)local_1b8._0_4_,
                       ((fVar27 * ((fVar18 + -1.0) * fVar30 + fVar18 * local_48)) /
                       (fVar24 * fVar24)) * (float)local_1b8._0_4_,lodPrec);
            fVar18 = (1.0 - (float)local_1c8._0_4_) - local_204;
            fVar24 = (fVar23 * fVar18) / (float)local_c8._0_4_;
            fVar18 = fVar18 / (float)local_c8._0_4_;
            fVar22 = (local_208 * local_204) / (float)local_128;
            fVar23 = (fVar29 * (float)local_1c8._0_4_) / local_138;
            fVar21 = local_204 / (float)local_128;
            fVar29 = (float)local_1c8._0_4_ / local_138;
            lVar7 = 0;
            do {
              fVar27 = *(float *)(local_e8 + lVar7 * 8) + fVar19;
              fVar25 = *(float *)(local_e8 + lVar7 * 8 + 4) + fVar20;
              fVar26 = fVar25 / fVar17;
              fVar30 = fVar27 / fVar16;
              fVar28 = (fVar16 * (fVar26 + -1.0) + fVar27) * local_78 +
                       (local_58 * fVar26 + fVar27 * (float)local_128) * local_b8;
              fVar27 = (fVar17 * (fVar30 + -1.0) + fVar25) * local_78 +
                       ((float)local_a8 * fVar30 + fVar25 * local_138) * local_b8;
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)local_228,
                         ((((fVar26 + -1.0) * local_1fc + fVar26 * local_200) *
                          (float)local_98._0_4_) / (fVar28 * fVar28)) * (float)local_1b8._0_4_,
                         ((((fVar30 + -1.0) * (float)local_68 + fVar30 * local_48) *
                          (float)local_88._0_4_) / (fVar27 * fVar27)) * (float)local_1b8._0_4_,
                         lodPrec);
              fVar27 = (float)(local_1e0 >> 0x20);
              uVar9 = -(uint)((float)local_1e0 <= (float)local_228._0_8_);
              uVar10 = -(uint)(SUB84(local_228._0_8_,4) <= fVar27);
              local_1e0 = CONCAT44(~uVar10 & (uint)SUB84(local_228._0_8_,4),
                                   ~uVar9 & (uint)(float)local_228._0_8_) |
                          CONCAT44((uint)fVar27 & uVar10,(uint)(float)local_1e0 & uVar9);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_228._0_4_ = (float)local_1e0 + (float)local_1d8._0_4_;
            local_228._4_4_ = (float)(local_1e0 >> 0x20) + (float)local_1d8._4_4_;
            local_218.m_data[0] = sampleParams->minLod;
            local_218.m_data[1] = sampleParams->maxLod;
            tcu::clampLodBounds(local_38,(Vec2 *)local_228,&local_218,lodPrec);
            bVar2 = tcu::isLookupResultValid
                              (&local_118,local_1a8,lookupPrec,
                               (fVar23 + fVar22 + fVar24) / (fVar29 + fVar21 + fVar18),
                               (Vec2 *)local_38,&local_1f8);
            if (!bVar2) {
              local_218.m_data[0] = -1.7014636e+38;
              tcu::RGBA::toVec((RGBA *)&local_218);
              tcu::PixelBufferAccess::setPixel(local_1e8,(Vec4 *)local_228,iVar5,iVar8,0);
              iVar3 = iVar3 + 1;
            }
          }
          else {
            uVar4 = 0xffffffffffffffff;
            do {
              if (uVar4 == 2) goto LAB_018c31c3;
              uVar1 = uVar4 + 1;
              lVar7 = uVar4 + 2;
              uVar4 = uVar1;
            } while (local_228[lVar7] != '\0');
            if (uVar1 < 3) goto LAB_018c2c54;
          }
LAB_018c31c3:
          iVar5 = iVar5 + 1;
        } while (iVar5 < (result->m_size).m_data[0]);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < (result->m_size).m_data[1]);
  }
  if (local_178.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture1DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture1DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getWidth();

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const float		coord		= projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy);
				const float		coordDx		= triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy) * float(srcSize);
				const float		coordDy		= triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx) * float(srcSize);

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx, coordDy, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const float	coordDxo	= triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo) * float(srcSize);
					const float	coordDyo	= triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo) * float(srcSize);
					const tcu::Vec2	lodO	= tcu::computeLodBoundsFromDerivates(coordDxo, coordDyo, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}